

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bindings.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  eid id;
  i injector;
  undefined4 local_2c;
  undefined1 local_28 [16];
  undefined4 *local_18;
  
  local_18 = &local_2c;
  local_2c = 1;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
  ::create<std::shared_ptr<interface>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
              *)local_28);
  if ((eid *)local_28._0_8_ != (eid *)0x0) {
    lVar1 = __dynamic_cast(local_28._0_8_,&interface::typeinfo,&implementation1::typeinfo,0);
    if (lVar1 != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
      }
      local_2c = 2;
      boost::ext::di::v1_3_0::core::
      injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
      ::create<std::shared_ptr<interface>,_0>
                ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>
                  *)local_28);
      if ((scope<interface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_dynamic_bindings_cpp:28:32),_int>
           )local_28._0_8_ != (eid *)0x0) {
        lVar1 = __dynamic_cast(local_28._0_8_,&interface::typeinfo,&implementation2::typeinfo,0);
        if (lVar1 != 0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
          }
          return 0;
        }
      }
      __assert_fail("dynamic_cast<implementation2*>(injector.create<std::shared_ptr<interface>>().get())"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/dynamic_bindings.cpp"
                    ,0x33,"int main()");
    }
  }
  __assert_fail("dynamic_cast<implementation1*>(injector.create<std::shared_ptr<interface>>().get())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/dynamic_bindings.cpp"
                ,0x2f,"int main()");
}

Assistant:

int main() {
  auto id = e1;

  /*<<create interface with `id = e1`>>*/
  auto injector = di::make_injector(dynamic_bindings(id));
  assert(dynamic_cast<implementation1*>(injector.create<std::shared_ptr<interface>>().get()));

  id = e2;
  /*<<create interface with `id = e2`>>*/
  assert(dynamic_cast<implementation2*>(injector.create<std::shared_ptr<interface>>().get()));
  (void)id;
}